

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointerGraph.h
# Opt level: O3

PSNode * __thiscall
dg::pta::LLVMPointerGraphBuilder::getPointsToNodeOrNull(LLVMPointerGraphBuilder *this,Value *val)

{
  const_iterator cVar1;
  iterator iVar2;
  PSNode *pPVar3;
  Value *local_18;
  
  local_18 = val;
  cVar1 = std::
          _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::PSNode_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::PSNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::PSNode_*>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::PSNode_*>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  *)(this + 0x98),&local_18);
  if ((cVar1.
       super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::PSNode_*>,_false>.
       _M_cur == (__node_type *)0x0) ||
     (pPVar3 = *(PSNode **)
                ((long)cVar1.
                       super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::PSNode_*>,_false>
                       ._M_cur + 0x10), pPVar3 == (PSNode *)0x0)) {
    local_18 = val;
    iVar2 = std::
            _Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
            ::find((_Hashtable<const_llvm::Value_*,_std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_std::allocator<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>_>,_std::__detail::_Select1st,_std::equal_to<const_llvm::Value_*>,_std::hash<const_llvm::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                    *)(this + 0x188),&local_18);
    if (iVar2.
        super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
        ._M_cur == (__node_type *)0x0) {
      pPVar3 = (PSNode *)0x0;
    }
    else {
      pPVar3 = *(PSNode **)
                ((long)iVar2.
                       super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                       ._M_cur + 0x28);
      if (pPVar3 == (PSNode *)0x0) {
        pPVar3 = *(PSNode **)
                  (*(long *)((long)iVar2.
                                   super__Node_iterator_base<std::pair<const_llvm::Value_*const,_dg::pta::LLVMPointerGraphBuilder::PSNodesSeq>,_false>
                                   ._M_cur + 0x18) + -8);
      }
    }
  }
  return pPVar3;
}

Assistant:

PSNode *getPointsToNodeOrNull(const llvm::Value *val) {
        // if we have a mapping for this node (e.g. the original
        // node was optimized away and replaced by mapping),
        // return it
        if (auto *mp = mapping.get(val))
            return mp;
        if (auto *nds = getNodes(val)) {
            // otherwise get the representant of the built nodes
            return nds->getRepresentant();
        }

        // not built!
        return nullptr;
    }